

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl
          (ChElementCableANCF *this,ChVector<double> *pA,ChVector<double> *dA,ChVector<double> *pB,
          ChVector<double> *dB,ChVector<double> *pA_dt,ChVector<double> *dA_dt,
          ChVector<double> *pB_dt,ChVector<double> *dB_dt,ChVectorDynamic<> *Fi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  undefined1 (*pauVar5) [64];
  void *pvVar6;
  undefined8 *puVar7;
  double *pdVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChVectorN<double,_12> Fcurv;
  ChVectorN<double,_12> Faxial;
  ChVectorN<double,_12> vel_vector;
  ChMatrixNM<double,_4,_3> d;
  CableANCF_ForceAxial myformulaAx;
  CableANCF_ForceCurv myformulaCurv;
  undefined1 local_900 [32];
  undefined1 auStack_8e0 [32];
  undefined1 aauStack_8c0 [2] [32];
  Matrix<double,_12,_1,_0,_12,_1> local_880;
  double local_800;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7d8;
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_780;
  double local_778;
  double local_770;
  double local_768;
  double local_760;
  double local_758;
  double local_750;
  double local_748;
  ChIntegrable1D<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_740;
  ChElementCableANCF *local_738;
  double *local_730;
  double *local_728;
  ChIntegrable1D<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> local_560;
  ChElementCableANCF *local_558;
  double *local_550;
  double *local_548;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                  ,0x1bc,
                  "void chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, ChVectorDynamic<> &)"
                 );
  }
  peVar4 = (this->section).
           super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                  ,0x1bd,
                  "void chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, ChVectorDynamic<> &)"
                 );
  }
  dVar1 = *(double *)(peVar4 + 0x20);
  dVar2 = *(double *)(peVar4 + 0x28);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2;
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar13,auVar10);
  dVar3 = *(double *)(peVar4 + 0x18);
  local_7a0 = pA->m_data[0];
  local_798 = pA->m_data[1];
  local_790 = pA->m_data[2];
  local_788 = dA->m_data[0];
  local_780 = dA->m_data[1];
  local_778 = dA->m_data[2];
  local_770 = pB->m_data[0];
  local_768 = pB->m_data[1];
  local_760 = pB->m_data[2];
  local_758 = dB->m_data[0];
  local_750 = dB->m_data[1];
  local_748 = dB->m_data[2];
  local_800 = pA_dt->m_data[0];
  local_7f8 = pA_dt->m_data[1];
  local_7f0 = pA_dt->m_data[2];
  local_7e8 = dA_dt->m_data[0];
  local_7e0 = dA_dt->m_data[1];
  local_7d8 = dA_dt->m_data[2];
  local_7d0 = pB_dt->m_data[0];
  local_7c8 = pB_dt->m_data[1];
  local_7c0 = pB_dt->m_data[2];
  local_7b8 = dB_dt->m_data[0];
  local_7b0 = dB_dt->m_data[1];
  local_7a8 = dB_dt->m_data[2];
  local_740._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_00b5b698;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[8]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[9]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [10] = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[1]
       = SUB648(ZEXT864(0),4);
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[4]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[8];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[5]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[9];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[6]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[10];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[7]
       = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[0xb];
  local_738 = this;
  local_730 = &local_7a0;
  local_728 = &local_800;
  ChQuadrature::Integrate1D<Eigen::Matrix<double,12,1,0,12,1>>(&local_880,&local_740,0.0,1.0,5);
  dVar3 = auVar10._0_8_ * dVar3 * (this->super_ChElementBeam).length;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[0];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[1]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[1];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[2]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[2];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[3]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[3];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[4]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[4];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[5]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[5];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[6]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[6];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[7]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[7];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[8]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[8];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[9]
       = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[9];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [10] = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                 m_data.array[10];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0xb] = dVar3 * local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
                  .m_data.array[0xb];
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    pdVar8 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar8 != (double *)0x0) {
      free((void *)pdVar8[-1]);
    }
    pvVar6 = malloc(0xa0);
    if (pvVar6 == (void *)0x0) {
      pdVar8 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x38) = pvVar6;
      pdVar8 = (double *)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar8 == (double *)0x0) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar8;
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0xc;
  }
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, 12, 1>, T1 = double, T2 = double]"
                 );
  }
  pdVar8 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  *pdVar8 = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
            m_data.array[0];
  pdVar8[1] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
              m_data.array[1];
  pdVar8[2] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
              m_data.array[2];
  pdVar8[3] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
              m_data.array[3];
  pdVar8[4] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
              m_data.array[4];
  pdVar8[5] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
              m_data.array[5];
  pdVar8[6] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
              m_data.array[6];
  pdVar8[7] = local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
              m_data.array[7];
  lVar9 = 8;
  do {
    pdVar8[lVar9] =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xc);
  local_560._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_00b5b6d8;
  local_900 = SUB6432(ZEXT864(0),0) << 0x20;
  aauStack_8c0[0] = (undefined1  [32])0x0;
  auStack_8e0 = aauStack_8c0[0];
  local_558 = this;
  local_550 = &local_7a0;
  local_548 = &local_800;
  ChQuadrature::Integrate1D<Eigen::Matrix<double,12,1,0,12,1>>
            ((Matrix<double,_12,_1,_0,_12,_1> *)local_900,&local_560,0.0,1.0,3);
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0xc)
  {
    dVar1 = dVar2 * dVar1 * (this->super_ChElementBeam).length;
    pauVar5 = (undefined1 (*) [64])
              (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar1;
    auVar11 = vbroadcastsd_avx512f(auVar14);
    auVar12._32_32_ = auStack_8e0;
    auVar12._0_32_ = local_900;
    auVar12 = vmulpd_avx512f(auVar11,auVar12);
    auVar12 = vaddpd_avx512f(auVar12,*(undefined1 (*) [64])
                                      (this->m_GenForceVec0).
                                      super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                                      .m_storage.m_data.array);
    auVar12 = vsubpd_avx512f(*pauVar5,auVar12);
    *pauVar5 = auVar12;
    lVar9 = 0;
    do {
      *(double *)(pauVar5[1] + lVar9 * 8) =
           *(double *)(pauVar5[1] + lVar9 * 8) -
           (dVar1 * *(double *)(aauStack_8c0[0] + lVar9 * 8) +
           (this->m_GenForceVec0).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
           m_storage.m_data.array[lVar9 + 8]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 12, 1>>, const Eigen::Matrix<double, 12, 1>>, const Eigen::Matrix<double, 12, 1>>, Functor = Eigen::internal::sub_assign_op<double, double>]"
               );
}

Assistant:

void ChElementCableANCF::ComputeInternalForces_Impl(const ChVector<>& pA,
                                                    const ChVector<>& dA,
                                                    const ChVector<>& pB,
                                                    const ChVector<>& dB,
                                                    const ChVector<>& pA_dt,
                                                    const ChVector<>& dA_dt,
                                                    const ChVector<>& pB_dt,
                                                    const ChVector<>& dB_dt,
                                                    ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(section);

    double Area = section->Area;
    double E = section->E;
    double I = section->I;

    // this matrix will be used in both CableANCF_ForceAxial and CableANCF_ForceCurv integrators
    ChMatrixNM<double, 4, 3> d;
    d(0, 0) = pA.x();
    d(0, 1) = pA.y();
    d(0, 2) = pA.z();
    d(1, 0) = dA.x();
    d(1, 1) = dA.y();
    d(1, 2) = dA.z();
    d(2, 0) = pB.x();
    d(2, 1) = pB.y();
    d(2, 2) = pB.z();
    d(3, 0) = dB.x();
    d(3, 1) = dB.y();
    d(3, 2) = dB.z();

    // this matrix will be used in both CableANCF_ForceAxial and CableANCF_ForceCurv integrators
    ChVectorN<double, 12> vel_vector;
    vel_vector(0) = pA_dt.x();
    vel_vector(1) = pA_dt.y();
    vel_vector(2) = pA_dt.z();
    vel_vector(3) = dA_dt.x();
    vel_vector(4) = dA_dt.y();
    vel_vector(5) = dA_dt.z();
    vel_vector(6) = pB_dt.x();
    vel_vector(7) = pB_dt.y();
    vel_vector(8) = pB_dt.z();
    vel_vector(9) = dB_dt.x();
    vel_vector(10) = dB_dt.y();
    vel_vector(11) = dB_dt.z();

    // 1)
    // Integrate   (strainD'*strain)

    class CableANCF_ForceAxial : public ChIntegrable1D<ChVectorN<double, 12>> {
      public:
        ChElementCableANCF* element;
        ChMatrixNM<double, 4, 3>* d;  // this is an external matrix, use pointer
        ChVectorN<double, 12>* d_dt;  // this is an external matrix, use pointer
        ChMatrixNM<double, 3, 12> Sd;
        ChElementCableANCF::ShapeVector Nd;
        ChMatrixNM<double, 1, 12> strainD;
        ChMatrixNM<double, 1, 3> Nd_d;

        // Evaluate (strainD'*strain)  at point x
        virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Nd_d = Nd * (*d);
            strainD = Nd_d * Sd;

            // strain = (Nd*(d*d')*Nd'-1)*0.5;
            double strain = 0.5 * (Nd_d.dot(Nd_d) - 1);

            // Add damping forces if selected
            if (element->m_use_damping)
                strain += (element->m_alpha) * (strainD * (*d_dt))(0, 0);

            result = strainD.transpose() * strain;
        }
    };

    CableANCF_ForceAxial myformulaAx;
    myformulaAx.d = &d;
    myformulaAx.d_dt = &vel_vector;
    myformulaAx.element = this;

    ChVectorN<double, 12> Faxial;
    Faxial.setZero();
    ChQuadrature::Integrate1D<ChVectorN<double, 12>>(Faxial,       // result of integration will go there
                                                     myformulaAx,  // formula to integrate
                                                     0,            // start of x
                                                     1,            // end of x
                                                     5             // order of integration
    );
    Faxial *= -E * Area * length;

    Fi = Faxial;

    // 2)
    // Integrate   (k_e'*k_e)

    class CableANCF_ForceCurv : public ChIntegrable1D<ChVectorN<double, 12>> {
      public:
        ChElementCableANCF* element;
        ChMatrixNM<double, 4, 3>* d;  // this is an external matrix, use pointer
        ChVectorN<double, 12>* d_dt;  // this is an external matrix, use pointer
        ChMatrixNM<double, 3, 12> Sd;
        ChMatrixNM<double, 3, 12> Sdd;
        ChElementCableANCF::ShapeVector Nd;
        ChElementCableANCF::ShapeVector Ndd;
        ChMatrixNM<double, 1, 12> g_e;
        ChMatrixNM<double, 1, 12> f_e;
        ChMatrixNM<double, 1, 12> k_e;
        ChMatrixNM<double, 3, 12> fe1;

        // Evaluate  at point x
        virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);
            element->ShapeFunctionsDerivatives2(Ndd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            // Sdd=[Ndd1*eye(3) Ndd2*eye(3) Ndd3*eye(3) Ndd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Sdd.setZero();
            for (int i = 0; i < 4; i++) {
                Sdd(0, 3 * i + 0) = Ndd(i);
                Sdd(1, 3 * i + 1) = Ndd(i);
                Sdd(2, 3 * i + 2) = Ndd(i);
            }

            ChVector<> vr_x((*d).transpose() * Nd.transpose());
            ChVector<> vr_xx((*d).transpose() * Ndd.transpose());
            ChVector<> vf1 = Vcross(vr_x, vr_xx);
            double f = vf1.Length();
            double g1 = vr_x.Length();
            double g = pow(g1, 3);
            double k = f / g;

            g_e = (3 * g1) * Nd * (*d) * Sd;

            // do:  fe1=cross(Sd,r_xxrep)+cross(r_xrep,Sdd);
            for (int col = 0; col < 12; ++col) {
                ChVector<> Sd_i = Sd.col(col);
                fe1.col(col) = Vcross(Sd_i, vr_xx).eigen();
                ChVector<> Sdd_i = Sdd.col(col);
                fe1.col(col) += Vcross(vr_x, Sdd_i).eigen();
            }
            ChVectorN<double, 3> f1 = vf1.eigen();

            if (f == 0)
                f_e = f1.transpose() * fe1;
            else {
                f_e = (1 / f) * f1.transpose() * fe1;
            }

            k_e = (f_e * g - g_e * f) * (1 / (pow(g, 2)));

            // Add damping if selected by user: curvature rate
            if (element->m_use_damping)
                k += (element->m_alpha) * (k_e * (*d_dt))(0, 0);

            result = k * k_e.transpose();
        }
    };

    CableANCF_ForceCurv myformulaCurv;
    myformulaCurv.d = &d;
    myformulaCurv.d_dt = &vel_vector;
    myformulaCurv.element = this;

    ChVectorN<double, 12> Fcurv;
    Fcurv.setZero();
    ChQuadrature::Integrate1D<ChVectorN<double, 12>>(Fcurv,          // result of integration will go there
                                                     myformulaCurv,  // formula to integrate
                                                     0,              // start of x
                                                     1,              // end of x
                                                     3               // order of integration
    );

    // Also subtract contribution of initial configuration
    Fi -= (E * I * length) * Fcurv + m_GenForceVec0;
}